

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O2

void __thiscall
QHstsCache::updateKnownHost
          (QHstsCache *this,QString *host,QDateTime *expires,bool includeSubDomains)

{
  bool bVar1;
  iterator __position;
  PolicyFlags flags;
  long in_FS_OFFSET;
  pair<const_QHstsCache::HostName,_QHstsPolicy> local_a0;
  QHstsPolicy newPolicy;
  HostName local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = is_valid_domain_name(host);
  if (!bVar1) goto LAB_0016c83a;
  local_68.fragment.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.fragment.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  HostName::HostName(&local_68,host);
  __position = std::
               _Rb_tree<QHstsCache::HostName,_std::pair<const_QHstsCache::HostName,_QHstsPolicy>,_std::_Select1st<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
               ::find((_Rb_tree<QHstsCache::HostName,_std::pair<const_QHstsCache::HostName,_QHstsPolicy>,_std::_Select1st<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
                       *)this,&local_68);
  newPolicy.d.d.ptr = (QSharedDataPointer<QHstsPolicyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  flags.super_QFlagsStorageHelper<QHstsPolicy::PolicyFlag,_4>.
  super_QFlagsStorage<QHstsPolicy::PolicyFlag>.i._1_3_ = 0;
  flags.super_QFlagsStorageHelper<QHstsPolicy::PolicyFlag,_4>.
  super_QFlagsStorage<QHstsPolicy::PolicyFlag>.i._0_1_ = includeSubDomains;
  QHstsPolicy::QHstsPolicy(&newPolicy,expires,flags,&local_68.name,DecodedMode);
  bVar1 = QHstsPolicy::isExpired(&newPolicy);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->knownHosts)._M_t._M_impl.super__Rb_tree_header) {
    if (!bVar1) {
      std::pair<const_QHstsCache::HostName,_QHstsPolicy>::
      pair<const_QHstsCache::HostName,_QHstsPolicy,_true>(&local_a0,&local_68,&newPolicy);
      std::
      _Rb_tree<QHstsCache::HostName,std::pair<QHstsCache::HostName_const,QHstsPolicy>,std::_Select1st<std::pair<QHstsCache::HostName_const,QHstsPolicy>>,std::less<QHstsCache::HostName>,std::allocator<std::pair<QHstsCache::HostName_const,QHstsPolicy>>>
      ::_M_insert_unique<std::pair<QHstsCache::HostName_const,QHstsPolicy>>
                ((_Rb_tree<QHstsCache::HostName,std::pair<QHstsCache::HostName_const,QHstsPolicy>,std::_Select1st<std::pair<QHstsCache::HostName_const,QHstsPolicy>>,std::less<QHstsCache::HostName>,std::allocator<std::pair<QHstsCache::HostName_const,QHstsPolicy>>>
                  *)this,&local_a0);
      std::pair<const_QHstsCache::HostName,_QHstsPolicy>::~pair(&local_a0);
      goto LAB_0016c813;
    }
  }
  else {
    if (bVar1) {
      std::
      _Rb_tree<QHstsCache::HostName,std::pair<QHstsCache::HostName_const,QHstsPolicy>,std::_Select1st<std::pair<QHstsCache::HostName_const,QHstsPolicy>>,std::less<QHstsCache::HostName>,std::allocator<std::pair<QHstsCache::HostName_const,QHstsPolicy>>>
      ::erase_abi_cxx11_((_Rb_tree<QHstsCache::HostName,std::pair<QHstsCache::HostName_const,QHstsPolicy>,std::_Select1st<std::pair<QHstsCache::HostName_const,QHstsPolicy>>,std::less<QHstsCache::HostName>,std::allocator<std::pair<QHstsCache::HostName_const,QHstsPolicy>>>
                          *)this,__position);
    }
    else {
      bVar1 = operator!=((QHstsPolicy *)&__position._M_node[2]._M_parent,&newPolicy);
      if (!bVar1) goto LAB_0016c826;
      QHstsPolicy::operator=((QHstsPolicy *)&__position._M_node[2]._M_parent,&newPolicy);
    }
LAB_0016c813:
    if (this->hstsStore != (QHstsStore *)0x0) {
      QHstsStore::addToObserved(this->hstsStore,&newPolicy);
    }
  }
LAB_0016c826:
  QHstsPolicy::~QHstsPolicy(&newPolicy);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
LAB_0016c83a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHstsCache::updateKnownHost(const QString &host, const QDateTime &expires,
                                 bool includeSubDomains)
{
    if (!is_valid_domain_name(host))
        return;

    // HSTS is a per-host policy, regardless of protocol, port or any of the other
    // details in an URL; so we only want the host part.  QUrl::host handles
    // IDNA 2003 (RFC3490) for us, as required by HSTS (RFC6797, section 10).
    const HostName hostName(host);
    const auto pos = knownHosts.find(hostName);
    QHstsPolicy::PolicyFlags flags;
    if (includeSubDomains)
        flags = QHstsPolicy::IncludeSubDomains;

    const QHstsPolicy newPolicy(expires, flags, hostName.name);
    if (pos == knownHosts.end()) {
        // A new, previously unknown host.
        if (newPolicy.isExpired()) {
            // Nothing to do at all - we did not know this host previously,
            // we do not have to - since its policy expired.
            return;
        }

        knownHosts.insert({hostName, newPolicy});
#if QT_CONFIG(settings)
        if (hstsStore)
            hstsStore->addToObserved(newPolicy);
#endif // QT_CONFIG(settings)
        return;
    }

    if (newPolicy.isExpired())
        knownHosts.erase(pos);
    else  if (pos->second != newPolicy)
        pos->second = newPolicy;
    else
        return;

#if QT_CONFIG(settings)
    if (hstsStore)
        hstsStore->addToObserved(newPolicy);
#endif // QT_CONFIG(settings)
}